

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::IsOn(char *val)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  
  if (val == (char *)0x0) {
    return false;
  }
  bVar1 = *val;
  uVar3 = bVar1 - 0x4f;
  uVar4 = (ulong)uVar3;
  if (uVar3 < 0x2b) {
    if ((0x100000001U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_001be04f;
    if ((0x2000000020U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_001be086;
    if ((0x40000000400U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_001bdffd;
  }
  else {
LAB_001bdffd:
    if (bVar1 != 0x31) {
      return false;
    }
    if (val[1] == '\0') {
      return true;
    }
    if (0x2a < uVar3) {
      return false;
    }
    if ((0x100000001U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x2000000020U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_001be086;
      if ((0x40000000400U >> (uVar4 & 0x3f) & 1) == 0) {
        return false;
      }
    }
    else {
LAB_001be04f:
      if (((byte)(val[1] | 0x20U) == 0x6e) && (val[2] == '\0')) {
        return true;
      }
      if (bVar1 < 0x74) {
        if (bVar1 == 0x54) goto LAB_001be086;
        if (bVar1 != 0x59) {
          return false;
        }
      }
      else {
        if (bVar1 == 0x74) goto LAB_001be086;
        if (bVar1 != 0x79) {
          return false;
        }
      }
    }
  }
  cVar2 = val[1];
  if (cVar2 == '\0') {
    return true;
  }
  if ((((cVar2 == 'e') || (cVar2 == 'E')) && ((byte)(val[2] | 0x20U) == 0x73)) && (val[3] == '\0'))
  {
    return true;
  }
  if ((bVar1 | 0x20) != 0x74) {
    return false;
  }
LAB_001be086:
  if ((((byte)(val[1] | 0x20U) == 0x72) && ((byte)(val[2] | 0x20U) == 0x75)) &&
     (((byte)(val[3] | 0x20U) == 0x65 && (val[4] == '\0')))) {
    return true;
  }
  return false;
}

Assistant:

bool cmSystemTools::IsOn(const char* val)
{
  if (!val) {
    return false;
  }
  /* clang-format off */
  // "1"
  if (val[0] == '1' && val[1] == '\0') {
    return true;
  }
  // "ON"
  if ((val[0] == 'O' || val[0] == 'o') &&
      (val[1] == 'N' || val[1] == 'n') && val[2] == '\0') {
    return true;
  }
  // "Y", "YES"
  if ((val[0] == 'Y' || val[0] == 'y') && (val[1] == '\0' || (
      (val[1] == 'E' || val[1] == 'e') &&
      (val[2] == 'S' || val[2] == 's') && val[3] == '\0'))) {
    return true;
  }
  // "TRUE"
  if ((val[0] == 'T' || val[0] == 't') &&
      (val[1] == 'R' || val[1] == 'r') &&
      (val[2] == 'U' || val[2] == 'u') &&
      (val[3] == 'E' || val[3] == 'e') && val[4] == '\0') {
    return true;
  }
  /* clang-format on */
  return false;
}